

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.h
# Opt level: O3

void __thiscall CGL::AppConfig::AppConfig(AppConfig *this)

{
  undefined1 auVar1 [16];
  
  (this->pathtracer_filename)._M_dataplus._M_p = (pointer)&(this->pathtracer_filename).field_2;
  (this->pathtracer_filename)._M_string_length = 0;
  (this->pathtracer_filename).field_2._M_local_buf[0] = '\0';
  (this->aperture_filename)._M_dataplus._M_p = (pointer)&(this->aperture_filename).field_2;
  (this->aperture_filename)._M_string_length = 0;
  (this->aperture_filename).field_2._M_local_buf[0] = '\0';
  (this->ghost_aperture_filename)._M_dataplus._M_p =
       (pointer)&(this->ghost_aperture_filename).field_2;
  (this->ghost_aperture_filename)._M_string_length = 0;
  (this->ghost_aperture_filename).field_2._M_local_buf[0] = '\0';
  this->pathtracer_ns_aa = 1;
  this->pathtracer_max_ray_depth = 1;
  this->pathtracer_ns_area_light = 1;
  this->pathtracer_ns_diff = 1;
  this->pathtracer_ns_glsy = 1;
  this->pathtracer_ns_refr = 1;
  this->pathtracer_num_threads = 1;
  this->pathtracer_envmap = (HDRImageBuffer *)0x0;
  this->pathtracer_samples_per_patch = 0x20;
  this->pathtracer_max_tolerance = 0.05;
  this->pathtracer_direct_hemisphere_sample = false;
  std::__cxx11::string::_M_replace((ulong)&this->pathtracer_filename,0,(char *)0x0,0x1e778e);
  auVar1 = vmovhps_avx(ZEXT816(0) << 0x40,0x4012cccccccccccd);
  this->pathtracer_lensRadius = (double)auVar1._0_8_;
  this->pathtracer_focalDistance = (double)auVar1._8_8_;
  std::__cxx11::string::_M_replace
            ((ulong)&this->aperture_filename,0,(char *)(this->aperture_filename)._M_string_length,
             0x1e778e);
  this->pathtracer_lens_flare_intensity = 1.0;
  this->pathtracer_lens_flare_radius = 25.0;
  std::__cxx11::string::_M_replace
            ((ulong)&this->ghost_aperture_filename,0,
             (char *)(this->ghost_aperture_filename)._M_string_length,0x1e778e);
  return;
}

Assistant:

AppConfig () {

    pathtracer_ns_aa = 1;
    pathtracer_max_ray_depth = 1;
    pathtracer_ns_area_light = 1;

    pathtracer_ns_diff = 1;
    pathtracer_ns_glsy = 1;
    pathtracer_ns_refr = 1;

    pathtracer_num_threads = 1;
    pathtracer_envmap = NULL;

    pathtracer_samples_per_patch = 32;
    pathtracer_max_tolerance = 0.05f;
    pathtracer_direct_hemisphere_sample = false;

    pathtracer_filename = "";
    pathtracer_lensRadius = 0.0;
    pathtracer_focalDistance = 4.7;

    // Begin Lens Flare implementation
    aperture_filename = "";
    pathtracer_lens_flare_radius = 25.0;
    pathtracer_lens_flare_intensity = 1;
		ghost_aperture_filename = "";
  }